

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

void __thiscall
WScriptJsrt::CallbackMessage::CallbackMessage(CallbackMessage *this,uint time,JsValueRef function)

{
  uint uVar1;
  JsErrorCode JVar2;
  
  (this->super_MessageBase).m_time = time;
  uVar1 = MessageBase::s_messageCount + 1;
  (this->super_MessageBase).m_id = MessageBase::s_messageCount;
  MessageBase::s_messageCount = uVar1;
  (this->super_MessageBase)._vptr_MessageBase = (_func_int **)&PTR__CallbackMessage_00187378;
  this->m_function = function;
  JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtAddRef)(function,(uint *)0x0);
  if (JVar2 == JsNoError) {
    return;
  }
  PAL_wprintf(L"FATAL ERROR: ChakraRTInterface::JsAddRef failed in WScriptJsrt::CallbackMessage::`ctor`. error=0x%x\n"
              ,(ulong)JVar2);
  PAL_exit(1);
}

Assistant:

WScriptJsrt::CallbackMessage::CallbackMessage(unsigned int time, JsValueRef function) : MessageBase(time), m_function(function)
{
    JsErrorCode error = ChakraRTInterface::JsAddRef(m_function, nullptr);
    if (error != JsNoError)
    {
        // Simply report a fatal error and exit because continuing from this point would result in inconsistent state
        // and FailFast telemetry would not be useful.
        wprintf(_u("FATAL ERROR: ChakraRTInterface::JsAddRef failed in WScriptJsrt::CallbackMessage::`ctor`. error=0x%x\n"), error);
        exit(1);
    }
}